

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void sf_glad_gl_load_GL_VERSION_4_2(GLADuserptrloadfunc load,void *userptr)

{
  undefined8 in_RSI;
  code *in_RDI;
  
  if (SF_GLAD_GL_VERSION_4_2 != 0) {
    sf_glad_glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC)(*in_RDI)(in_RSI,"glBindImageTexture");
    sf_glad_glDrawArraysInstancedBaseInstance =
         (PFNGLDRAWARRAYSINSTANCEDBASEINSTANCEPROC)
         (*in_RDI)(in_RSI,"glDrawArraysInstancedBaseInstance");
    sf_glad_glDrawElementsInstancedBaseInstance =
         (PFNGLDRAWELEMENTSINSTANCEDBASEINSTANCEPROC)
         (*in_RDI)(in_RSI,"glDrawElementsInstancedBaseInstance");
    sf_glad_glDrawElementsInstancedBaseVertexBaseInstance =
         (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCEPROC)
         (*in_RDI)(in_RSI,"glDrawElementsInstancedBaseVertexBaseInstance");
    sf_glad_glDrawTransformFeedbackInstanced =
         (PFNGLDRAWTRANSFORMFEEDBACKINSTANCEDPROC)
         (*in_RDI)(in_RSI,"glDrawTransformFeedbackInstanced");
    sf_glad_glDrawTransformFeedbackStreamInstanced =
         (PFNGLDRAWTRANSFORMFEEDBACKSTREAMINSTANCEDPROC)
         (*in_RDI)(in_RSI,"glDrawTransformFeedbackStreamInstanced");
    sf_glad_glGetActiveAtomicCounterBufferiv =
         (PFNGLGETACTIVEATOMICCOUNTERBUFFERIVPROC)
         (*in_RDI)(in_RSI,"glGetActiveAtomicCounterBufferiv");
    sf_glad_glGetInternalformativ =
         (PFNGLGETINTERNALFORMATIVPROC)(*in_RDI)(in_RSI,"glGetInternalformativ");
    sf_glad_glMemoryBarrier = (PFNGLMEMORYBARRIERPROC)(*in_RDI)(in_RSI,"glMemoryBarrier");
    sf_glad_glTexStorage1D = (PFNGLTEXSTORAGE1DPROC)(*in_RDI)(in_RSI,"glTexStorage1D");
    sf_glad_glTexStorage2D = (PFNGLTEXSTORAGE2DPROC)(*in_RDI)(in_RSI,"glTexStorage2D");
    sf_glad_glTexStorage3D = (PFNGLTEXSTORAGE3DPROC)(*in_RDI)(in_RSI,"glTexStorage3D");
  }
  return;
}

Assistant:

static void sf_glad_gl_load_GL_VERSION_4_2( GLADuserptrloadfunc load, void* userptr) {
    if(!SF_GLAD_GL_VERSION_4_2) return;
    sf_glad_glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC) load(userptr, "glBindImageTexture");
    sf_glad_glDrawArraysInstancedBaseInstance = (PFNGLDRAWARRAYSINSTANCEDBASEINSTANCEPROC) load(userptr, "glDrawArraysInstancedBaseInstance");
    sf_glad_glDrawElementsInstancedBaseInstance = (PFNGLDRAWELEMENTSINSTANCEDBASEINSTANCEPROC) load(userptr, "glDrawElementsInstancedBaseInstance");
    sf_glad_glDrawElementsInstancedBaseVertexBaseInstance = (PFNGLDRAWELEMENTSINSTANCEDBASEVERTEXBASEINSTANCEPROC) load(userptr, "glDrawElementsInstancedBaseVertexBaseInstance");
    sf_glad_glDrawTransformFeedbackInstanced = (PFNGLDRAWTRANSFORMFEEDBACKINSTANCEDPROC) load(userptr, "glDrawTransformFeedbackInstanced");
    sf_glad_glDrawTransformFeedbackStreamInstanced = (PFNGLDRAWTRANSFORMFEEDBACKSTREAMINSTANCEDPROC) load(userptr, "glDrawTransformFeedbackStreamInstanced");
    sf_glad_glGetActiveAtomicCounterBufferiv = (PFNGLGETACTIVEATOMICCOUNTERBUFFERIVPROC) load(userptr, "glGetActiveAtomicCounterBufferiv");
    sf_glad_glGetInternalformativ = (PFNGLGETINTERNALFORMATIVPROC) load(userptr, "glGetInternalformativ");
    sf_glad_glMemoryBarrier = (PFNGLMEMORYBARRIERPROC) load(userptr, "glMemoryBarrier");
    sf_glad_glTexStorage1D = (PFNGLTEXSTORAGE1DPROC) load(userptr, "glTexStorage1D");
    sf_glad_glTexStorage2D = (PFNGLTEXSTORAGE2DPROC) load(userptr, "glTexStorage2D");
    sf_glad_glTexStorage3D = (PFNGLTEXSTORAGE3DPROC) load(userptr, "glTexStorage3D");
}